

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

void array_bitset_ixor_test(void)

{
  int iVar1;
  _Bool _Var2;
  uint16_t value;
  array_container_t *src;
  array_container_t *dst;
  array_container_t *dst_00;
  array_container_t *src_1;
  array_container_t *arr;
  bitset_container_t *source;
  bitset_container_t *dest;
  bitset_container_t *dest_00;
  bitset_container_t *src_1_00;
  bitset_container_t *bitset;
  int x;
  uint uVar3;
  container_t *C;
  
  src = array_container_create();
  dst = array_container_create();
  dst_00 = array_container_create();
  src_1 = array_container_create();
  arr = array_container_create();
  source = bitset_container_create();
  dest = bitset_container_create();
  dest_00 = bitset_container_create();
  src_1_00 = bitset_container_create();
  bitset = bitset_container_create();
  for (uVar3 = 0; uVar3 < 0x10000; uVar3 = uVar3 + 3) {
    array_container_add(src,(uint16_t)uVar3);
    bitset_container_set(source,(uint16_t)uVar3);
  }
  for (uVar3 = 0; uVar3 < 0x10000; uVar3 = uVar3 + 0x3e) {
    array_container_add(src_1,(uint16_t)uVar3);
    bitset_container_set(src_1_00,(uint16_t)uVar3);
  }
  uVar3 = 0;
  while( true ) {
    value = (uint16_t)uVar3;
    if (uVar3 == 0x10000) break;
    if (((uint16_t)((short)((uVar3 & 0xffff) / 0x3e) * -0x3e + value) == 0) !=
        ((uint16_t)((short)((uVar3 & 0xffff) / 3) * -3 + value) == 0)) {
      array_container_add(arr,value);
      bitset_container_set(bitset,value);
    }
    uVar3 = uVar3 + 1;
  }
  array_container_copy(src,dst);
  bitset_container_copy(source,dest);
  array_container_copy(src,dst_00);
  array_container_add(dst_00,2);
  bitset_container_copy(source,dest_00);
  bitset_container_add(dest_00,2);
  iVar1 = arr->cardinality;
  C = (container_t *)0x0;
  _Var2 = bitset_array_container_ixor(src_1_00,src,&C);
  _assert_true((ulong)_Var2,"bitset_array_container_ixor(B2, A1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x16d);
  _assert_int_equal((long)iVar1,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x16e);
  _assert_int_equal((unsigned_long)C,(unsigned_long)src_1_00,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x170);
  C = (container_t *)0x0;
  _Var2 = array_bitset_container_ixor(src_1,source,&C);
  _assert_true((ulong)_Var2,"array_bitset_container_ixor(A2, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x173);
  _assert_int_equal((long)iVar1,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x174);
  _assert_int_not_equal
            ((unsigned_long)C,(unsigned_long)src_1,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
             ,0x175);
  bitset_container_free((bitset_container_t *)C);
  C = (container_t *)0x0;
  _Var2 = array_bitset_container_ixor(src,source,&C);
  _assert_true((ulong)!_Var2,"array_bitset_container_ixor(A1, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x17c);
  _assert_int_equal(0,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x17d);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  _Var2 = bitset_bitset_container_ixor(dest_00,dest,&C);
  _assert_true((ulong)!_Var2,"bitset_bitset_container_ixor(B1mod, B1copy, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x183);
  _assert_int_equal(1,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x184);
  array_container_free((array_container_t *)C);
  C = (container_t *)0x0;
  _Var2 = array_array_container_ixor(dst_00,dst,&C);
  _assert_true((ulong)!_Var2,"array_array_container_ixor(A1mod, A1copy, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x188);
  _assert_int_equal(1,(long)*C,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x189);
  array_container_free(arr);
  array_container_free(dst);
  bitset_container_free(source);
  bitset_container_free(dest);
  bitset_container_free(src_1_00);
  bitset_container_free(bitset);
  array_container_free((array_container_t *)C);
  return;
}

Assistant:

DEFINE_TEST(array_bitset_ixor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A1copy = array_container_create();
    array_container_t* A1mod = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B1copy = bitset_container_create();
    bitset_container_t* B1mod = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x += 3) {
        array_container_add(A1, x);
        bitset_container_set(B1, x);
    }

    // important: 62 is not divisible by 3
    for (int x = 0; x < (1 << 16); x += 62) {
        array_container_add(A2, x);
        bitset_container_set(B2, x);
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 == 0) ^ (x % 3 == 0)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    array_container_copy(A1, A1copy);
    bitset_container_copy(B1, B1copy);
    array_container_copy(A1, A1mod);
    array_container_add(A1mod, 2);
    bitset_container_copy(B1, B1mod);
    bitset_container_add(B1mod, 2);

    int cx = array_container_cardinality(AX);  // expected xor

    container_t* C = NULL;

    assert_true(bitset_array_container_ixor(B2, A1, &C));
    assert_int_equal(cx, bitset_container_cardinality(CAST_bitset(C)));
    // this case, result is inplace
    assert_ptr_equal(C, B2);

    C = NULL;
    assert_true(array_bitset_container_ixor(A2, B1, &C));
    assert_int_equal(cx, bitset_container_cardinality(CAST_bitset(C)));
    assert_ptr_not_equal(C, A2);  // nb A2 is destroyed
    // don't test a case where result can fit in the array
    // until this is implemented...at that point, make sure

    bitset_container_free(CAST_bitset(C));
    C = NULL;
    // xoring something with itself, getting array
    assert_false(array_bitset_container_ixor(A1, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));

    array_container_free(CAST_array(C));
    C = NULL;

    // B1mod and B1copy differ in position 2 only
    assert_false(bitset_bitset_container_ixor(B1mod, B1copy, &C));
    assert_int_equal(1, array_container_cardinality(CAST_array(C)));

    array_container_free(CAST_array(C));
    C = NULL;
    assert_false(array_array_container_ixor(A1mod, A1copy, &C));
    assert_int_equal(1, array_container_cardinality(CAST_array(C)));

    // array_container_free(A1); // disposed already
    //    array_container_free(A2); // has been disposed already
    array_container_free(AX);
    array_container_free(A1copy);

    bitset_container_free(B1);
    bitset_container_free(B1copy);
    bitset_container_free(B2);
    bitset_container_free(BX);
    array_container_free(CAST_array(C));
}